

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lua_cjson.c
# Opt level: O2

int lua_cjson_new(lua_State *l)

{
  undefined4 *puVar1;
  long lVar2;
  luaL_Reg reg [11];
  
  memcpy(reg,&DAT_00181c90,0xb0);
  fpconv_init();
  lua_createtable(l,0,0);
  puVar1 = (undefined4 *)lua_newuserdata(l,0x548);
  lua_createtable(l,0,0);
  lua_pushcclosure(l,json_destroy_config,0);
  lua_setfield(l,-2,"__gc");
  lua_setmetatable(l,-2);
  *(undefined8 *)(puVar1 + 0x148) = 0x200000000;
  *(undefined8 *)(puVar1 + 0x14a) = 0x3e80000000a;
  puVar1[0x150] = 1000;
  *(undefined8 *)(puVar1 + 0x14c) = 0xe00000000;
  *(undefined8 *)(puVar1 + 0x14e) = 0x100000001;
  strbuf_init((strbuf_t *)(puVar1 + 0x140),0);
  for (lVar2 = 0; lVar2 != 0x100; lVar2 = lVar2 + 1) {
    puVar1[lVar2] = 0xc;
  }
  puVar1[0x7b] = 0;
  puVar1[0x7d] = 1;
  puVar1[0x5b] = 2;
  puVar1[0x5d] = 3;
  puVar1[0x3a] = 8;
  *puVar1 = 10;
  puVar1[0x20] = 0xb;
  *(undefined8 *)(puVar1 + 9) = 0xb0000000b;
  puVar1[0xd] = 0xb;
  puVar1[0x66] = 0xd;
  puVar1[0x69] = 0xd;
  puVar1[0x49] = 0xd;
  puVar1[0x6e] = 0xd;
  puVar1[0x4e] = 0xd;
  puVar1[0x74] = 0xd;
  puVar1[0x22] = 0xd;
  *(undefined8 *)(puVar1 + 0x2b) = 0x90000000d;
  puVar1[0x2d] = 0xd;
  for (lVar2 = 0; lVar2 != 10; lVar2 = lVar2 + 1) {
    puVar1[lVar2 + 0x30] = 0xd;
  }
  for (lVar2 = 0; lVar2 != 0x100; lVar2 = lVar2 + 1) {
    *(undefined1 *)((long)puVar1 + lVar2 + 0x400) = 0;
  }
  *(undefined1 *)((long)puVar1 + 0x422) = 0x22;
  *(undefined1 *)(puVar1 + 0x117) = 0x5c;
  *(undefined1 *)((long)puVar1 + 0x42f) = 0x2f;
  *(undefined1 *)((long)puVar1 + 0x462) = 8;
  *(undefined2 *)(puVar1 + 0x11d) = 0x7509;
  *(undefined1 *)((long)puVar1 + 0x46e) = 10;
  *(undefined1 *)((long)puVar1 + 0x466) = 0xc;
  *(undefined1 *)((long)puVar1 + 0x472) = 0xd;
  luaL_setfuncs(l,reg,1);
  lua_pushlightuserdata(l,(void *)0x0);
  lua_setfield(l,-2,"null");
  lua_pushstring(l,"cjson");
  lua_setfield(l,-2,"NAME");
  lua_pushstring(l,"2.1devel");
  lua_setfield(l,-2,"VERSION");
  return 1;
}

Assistant:

static int lua_cjson_new(lua_State *l)
{
    luaL_Reg reg[] = {
        { "decode", json_decode },
        { "decode_invalid_numbers", json_cfg_decode_invalid_numbers },
        { "decode_max_depth", json_cfg_decode_max_depth },
        { "encode", json_encode },
        { "encode_invalid_numbers", json_cfg_encode_invalid_numbers },
        { "encode_keep_buffer", json_cfg_encode_keep_buffer },
        { "encode_max_depth", json_cfg_encode_max_depth },
        { "encode_number_precision", json_cfg_encode_number_precision },
        { "encode_sparse_array", json_cfg_encode_sparse_array },
        { "new", lua_cjson_new },
        { NULL, NULL }
    };

    /* Initialise number conversions */
    fpconv_init();

    /* cjson module table */
    lua_newtable(l);

    /* Register functions with config data as upvalue */
    json_create_config(l);
    luaL_setfuncs(l, reg, 1);

    /* Set cjson.null */
    lua_pushlightuserdata(l, NULL);
    lua_setfield(l, -2, "null");

    /* Set module name / version fields */
    lua_pushliteral(l, CJSON_MODNAME);
    lua_setfield(l, -2, "NAME");
    lua_pushliteral(l, CJSON_VERSION);
    lua_setfield(l, -2, "VERSION");

    return 1;
}